

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evdevdevice.h
# Opt level: O2

bool __thiscall EvdevDevice::addDevice(EvdevDevice *this,Input *input)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  Device local_18;
  
  iVar1 = access((input->path)._M_dataplus._M_p,0);
  if (iVar1 == -1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR: Cannot access \'");
    poVar2 = std::operator<<(poVar2,(string *)input);
    pcVar3 = "\'. Does it exist?";
  }
  else {
    local_18.fd = open((input->path)._M_dataplus._M_p,0x800);
    if (local_18.fd != 0) {
      local_18.role = input->role;
      std::vector<EvdevDevice::Device,_std::allocator<EvdevDevice::Device>_>::
      emplace_back<EvdevDevice::Device>(&this->_devices,&local_18);
      poVar2 = std::operator<<((ostream *)&std::cout,"Successfully added device \'");
      poVar2 = std::operator<<(poVar2,(string *)input);
      poVar2 = std::operator<<(poVar2,"\'.");
      std::endl<char,std::char_traits<char>>(poVar2);
      return true;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"ERROR: Cannot open \'");
    poVar2 = std::operator<<(poVar2,(string *)input);
    pcVar3 = "\'.";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::endl<char,std::char_traits<char>>(poVar2);
  return false;
}

Assistant:

bool EvdevDevice::addDevice(Input const& input)
{
  if(access(input.path.data(), F_OK ) != -1)
  {
    int fd = open(input.path.data(), O_RDONLY | O_NDELAY);
    if(!fd)
    {
      std::cerr << "ERROR: Cannot open '" << input.path << "'." << std::endl;
      return false;
    }

    _devices.push_back({fd, input.role});
    std::cout << "Successfully added device '" << input.path << "'." << std::endl;
  }

  else
  {
    std::cerr << "ERROR: Cannot access '" << input.path << "'. Does it exist?" << std::endl;
    return false;
  }

  return true;
}